

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

void curl_easy_reset(Curl_easy *data)

{
  Curl_easy *data_local;
  
  Curl_free_request_state(data);
  Curl_freeset(data);
  memset(&data->set,0,0x908);
  Curl_init_userdefined(data);
  memset(&data->progress,0,0x198);
  Curl_initinfo(data);
  (data->progress).flags = (data->progress).flags | 0x10;
  (data->state).current_speed = -1;
  memset(&(data->state).authhost,0,0x20);
  memset(&(data->state).authproxy,0,0x20);
  Curl_digest_cleanup(data);
  return;
}

Assistant:

void curl_easy_reset(struct Curl_easy *data)
{
  Curl_free_request_state(data);

  /* zero out UserDefined data: */
  Curl_freeset(data);
  memset(&data->set, 0, sizeof(struct UserDefined));
  (void)Curl_init_userdefined(data);

  /* zero out Progress data: */
  memset(&data->progress, 0, sizeof(struct Progress));

  /* zero out PureInfo data: */
  Curl_initinfo(data);

  data->progress.flags |= PGRS_HIDE;
  data->state.current_speed = -1; /* init to negative == impossible */

  /* zero out authentication data: */
  memset(&data->state.authhost, 0, sizeof(struct auth));
  memset(&data->state.authproxy, 0, sizeof(struct auth));
  Curl_digest_cleanup(data);
}